

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_easysrc.c
# Opt level: O2

CURLcode easysrc_perform(void)

{
  curl_slist *pcVar1;
  CURLcode CVar2;
  long lVar3;
  slist_wc *psVar4;
  
  if (easysrc_toohard != (slist_wc *)0x0) {
    CVar2 = easysrc_add(&easysrc_code,"");
    lVar3 = 0;
    while ((lVar3 != 0x20 && (CVar2 == CURLE_OK))) {
      CVar2 = easysrc_add(&easysrc_code,*(char **)((long)srchard + lVar3));
      lVar3 = lVar3 + 8;
    }
    if ((easysrc_toohard != (slist_wc *)0x0) && (CVar2 == CURLE_OK)) {
      CVar2 = CURLE_OK;
      psVar4 = easysrc_toohard;
      while ((pcVar1 = psVar4->first, pcVar1 != (curl_slist *)0x0 && (CVar2 == CURLE_OK))) {
        CVar2 = easysrc_add(&easysrc_code,pcVar1->data);
        psVar4 = (slist_wc *)&pcVar1->next;
      }
    }
    if ((CVar2 == CURLE_OK) && (CVar2 = easysrc_add(&easysrc_code,""), CVar2 == CURLE_OK)) {
      CVar2 = easysrc_add(&easysrc_code,"*/");
    }
    slist_wc_free_all(easysrc_toohard);
    easysrc_toohard = (slist_wc *)0x0;
    if (CVar2 != CURLE_OK) {
      easysrc_toohard = (slist_wc *)0x0;
      return CVar2;
    }
  }
  CVar2 = easysrc_add(&easysrc_code,"");
  if ((CVar2 == CURLE_OK) &&
     (CVar2 = easysrc_add(&easysrc_code,"ret = curl_easy_perform(hnd);"), CVar2 == CURLE_OK)) {
    CVar2 = easysrc_add(&easysrc_code,"");
    return CVar2;
  }
  return CVar2;
}

Assistant:

CURLcode easysrc_perform(void)
{
  CURLcode ret = CURLE_OK;
  /* Note any setopt calls which we could not convert */
  if(easysrc_toohard) {
    int i;
    struct curl_slist *ptr;
    ret = easysrc_add(&easysrc_code, "");
    /* Preamble comment */
    for(i = 0; srchard[i] && !ret; i++)
      ret = easysrc_add(&easysrc_code, srchard[i]);
    /* Each unconverted option */
    if(easysrc_toohard && !ret) {
      for(ptr = easysrc_toohard->first; ptr && !ret; ptr = ptr->next)
        ret = easysrc_add(&easysrc_code, ptr->data);
    }
    if(!ret)
      ret = easysrc_add(&easysrc_code, "");
    if(!ret)
      ret = easysrc_add(&easysrc_code, "*/");

    slist_wc_free_all(easysrc_toohard);
    easysrc_toohard = NULL;
  }

  if(!ret)
    ret = easysrc_add(&easysrc_code, "");
  if(!ret)
    ret = easysrc_add(&easysrc_code, "ret = curl_easy_perform(hnd);");
  if(!ret)
    ret = easysrc_add(&easysrc_code, "");

  return ret;
}